

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O2

QArrayDataPointer<QTzTransitionRule> *
QArrayDataPointer<QTzTransitionRule>::allocateGrow
          (QArrayDataPointer<QTzTransitionRule> *__return_storage_ptr__,
          QArrayDataPointer<QTzTransitionRule> *from,qsizetype n,GrowthPosition position)

{
  long lVar1;
  qsizetype qVar2;
  Data *pDVar3;
  long lVar4;
  Int IVar5;
  QTzTransitionRule *pQVar6;
  pair<QTypedArrayData<QTzTransitionRule>_*,_QTzTransitionRule_*> pVar7;
  
  if (from->d == (Data *)0x0) {
    qVar2 = 0;
  }
  else {
    qVar2 = (from->d->super_QArrayData).alloc;
  }
  if (qVar2 < from->size) {
    qVar2 = from->size;
  }
  if (position == GrowsAtEnd) {
    lVar1 = freeSpaceAtEnd(from);
  }
  else {
    lVar1 = freeSpaceAtBegin(from);
  }
  qVar2 = detachCapacity(from,(qVar2 + n) - lVar1);
  if (from->d == (Data *)0x0) {
    lVar1 = 0;
  }
  else {
    lVar1 = (from->d->super_QArrayData).alloc;
  }
  pVar7 = QTypedArrayData<QTzTransitionRule>::allocate(qVar2,(uint)(qVar2 <= lVar1));
  pQVar6 = pVar7.second;
  pDVar3 = pVar7.first;
  if (pQVar6 != (QTzTransitionRule *)0x0 && pDVar3 != (Data *)0x0) {
    if (position == GrowsAtBeginning) {
      lVar4 = ((pDVar3->super_QArrayData).alloc - (from->size + n)) / 2;
      lVar1 = 0;
      if (0 < lVar4) {
        lVar1 = lVar4;
      }
      lVar1 = lVar1 + n;
    }
    else {
      lVar1 = freeSpaceAtBegin(from);
    }
    if (from->d == (Data *)0x0) {
      IVar5 = 0;
    }
    else {
      IVar5 = (from->d->super_QArrayData).flags.
              super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
              super_QFlagsStorage<QArrayData::ArrayOption>.i;
    }
    pQVar6 = pQVar6 + lVar1;
    (pDVar3->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
    super_QFlagsStorage<QArrayData::ArrayOption>.i = IVar5;
  }
  __return_storage_ptr__->d = pDVar3;
  __return_storage_ptr__->ptr = pQVar6;
  __return_storage_ptr__->size = 0;
  return __return_storage_ptr__;
}

Assistant:

static QArrayDataPointer allocateGrow(const QArrayDataPointer &from, qsizetype n, QArrayData::GrowthPosition position)
    {
        // calculate new capacity. We keep the free capacity at the side that does not have to grow
        // to avoid quadratic behavior with mixed append/prepend cases

        // use qMax below, because constAllocatedCapacity() can be 0 when using fromRawData()
        qsizetype minimalCapacity = qMax(from.size, from.constAllocatedCapacity()) + n;
        // subtract the free space at the side we want to allocate. This ensures that the total size requested is
        // the existing allocation at the other side + size + n.
        minimalCapacity -= (position == QArrayData::GrowsAtEnd) ? from.freeSpaceAtEnd() : from.freeSpaceAtBegin();
        qsizetype capacity = from.detachCapacity(minimalCapacity);
        const bool grows = capacity > from.constAllocatedCapacity();
        auto [header, dataPtr] = Data::allocate(capacity, grows ? QArrayData::Grow : QArrayData::KeepSize);
        const bool valid = header != nullptr && dataPtr != nullptr;
        if (!valid)
            return QArrayDataPointer(header, dataPtr);

        // Idea: * when growing backwards, adjust pointer to prepare free space at the beginning
        //       * when growing forward, adjust by the previous data pointer offset
        dataPtr += (position == QArrayData::GrowsAtBeginning)
                ? n + qMax(0, (header->alloc - from.size - n) / 2)
                : from.freeSpaceAtBegin();
        header->flags = from.flags();
        return QArrayDataPointer(header, dataPtr);
    }